

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

float anon_unknown.dwarf_66e92::roundtrip<float>(float *in)

{
  float out;
  float *in_stack_00000218;
  float *in_stack_00000220;
  undefined4 local_c;
  
  (anonymous_namespace)::roundtrip_into<float,float>(in_stack_00000220,in_stack_00000218);
  return local_c;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}